

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void UserInterface::pushMessage(string *s,bool isError)

{
  ostream *poVar1;
  Vector2u VVar2;
  Uint8 blue;
  Uint8 green;
  Uint8 red;
  list<TextButton,_std::allocator<TextButton>_> *plVar3;
  Color local_400;
  Color local_3fc;
  _Any_data local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  TextButton local_3d0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)s);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (_messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl.
      _M_node._M_size < 4) {
    if (_messageList_abi_cxx11_.super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl.
        _M_node.super__List_node_base._M_next != (_List_node_base *)&_messageList_abi_cxx11_)
    goto LAB_0013b2cd;
  }
  else {
    std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::pop_back(&_messageList_abi_cxx11_);
    plVar3 = &_messageList_abi_cxx11_;
    while (plVar3 = (list<TextButton,_std::allocator<TextButton>_> *)
                    (plVar3->super__List_base<TextButton,_std::allocator<TextButton>_>)._M_impl.
                    _M_node.super__List_node_base._M_next, plVar3 != &_messageList_abi_cxx11_) {
      sf::Transformable::move((Transformable *)((long)plVar3 + 0x10U + 8),0.0,30.0);
    }
  }
  sf::Clock::restart(&_messageClock);
LAB_0013b2cd:
  sf::Color::Color(&local_400);
  if (isError) {
    red = 0xff;
    green = '\x1f';
    blue = green;
  }
  else {
    red = '\x1f';
    green = '=';
    blue = 0xff;
  }
  sf::Color::Color((Color *)&local_3d0,red,green,blue,200);
  local_400 = local_3d0.super_UIComponent.super_Drawable._vptr_Drawable._0_4_;
  sf::Color::Color(&local_3fc,'\0','\0','\0',200);
  VVar2 = Simulator::getWindowSize();
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e8 = 0;
  uStack_3e0 = 0;
  TextButton::TextButton
            (&local_3d0,s,&local_3fc,0x10,10.0,
             (float)((ulong)VVar2 >> 0x20) + -35.0 +
             (float)_messageList_abi_cxx11_.
                    super__List_base<TextButton,_std::allocator<TextButton>_>._M_impl._M_node.
                    _M_size * -30.0,&local_400,(Color *)&sf::Color::Black,
             (function<void_(int)> *)&local_3f8,0);
  std::__cxx11::list<TextButton,_std::allocator<TextButton>_>::push_front
            (&_messageList_abi_cxx11_,&local_3d0);
  TextButton::~TextButton(&local_3d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
  return;
}

Assistant:

void UserInterface::pushMessage(const string& s, bool isError) {
    cout << s << endl;
    if (_messageList.size() >= 4) {
        _messageList.pop_back();
        for (auto listIter = _messageList.begin(); listIter != _messageList.end(); ++listIter) {
            listIter->move(0.0f, 30.0f);
        }
        _messageClock.restart();
    } else if (_messageList.empty()) {
        _messageClock.restart();
    }
    
    Color messageColor;
    if (!isError) {
        messageColor = Color(31, 61, 255, 200);
    } else {
        messageColor = Color(255, 31, 31, 200);
    }
    _messageList.push_front(TextButton(s, Color(0, 0, 0, 200), 16, 10.0f, Simulator::getWindowSize().y - 35.0f - _messageList.size() * 30.0f, messageColor, Color::Black, nullptr));
}